

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O3

void __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>::
~Tokeniser(Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
           *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  this->_vptr_Tokeniser = (_func_int **)&PTR__Tokeniser_002f5f20;
  pcVar2 = (this->currentStringValue)._M_dataplus._M_p;
  paVar1 = &(this->currentStringValue).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((this->location).sourceCode.object);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((this->startLocation).sourceCode.object);
  return;
}

Assistant:

virtual ~Tokeniser() = default;